

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O3

int arenas_narenas_ctl(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
                      size_t newlen)

{
  ulong uVar1;
  int iVar2;
  size_t __n;
  uint local_2c;
  
  iVar2 = pthread_mutex_trylock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
  if (iVar2 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&ctl_mtx);
    ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  ctl_mtx.field_0.field_0.prof_data.n_lock_ops = ctl_mtx.field_0.field_0.prof_data.n_lock_ops + 1;
  if (&(ctl_mtx.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    ctl_mtx.field_0.witness.link.qre_prev =
         (witness_t *)(ctl_mtx.field_0.field_0.prof_data.n_owner_switches + 1);
    ctl_mtx.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
  }
  iVar2 = 1;
  if (newp == (void *)0x0 && newlen == 0) {
    local_2c = ctl_arenas->narenas;
    iVar2 = 0;
    if (oldlenp != (size_t *)0x0 && oldp != (void *)0x0) {
      uVar1 = *oldlenp;
      if (uVar1 == 4) {
        *(uint *)oldp = local_2c;
        iVar2 = 0;
      }
      else {
        __n = 4;
        if (uVar1 < 4) {
          __n = uVar1;
        }
        switchD_015df945::default(oldp,&local_2c,__n);
        *oldlenp = __n;
        iVar2 = 0x16;
      }
    }
  }
  ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
  return iVar2;
}

Assistant:

static int
arenas_narenas_ctl(tsd_t *tsd, const size_t *mib, size_t miblen,
    void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	unsigned narenas;

	malloc_mutex_lock(tsd_tsdn(tsd), &ctl_mtx);
	READONLY();
	narenas = ctl_arenas->narenas;
	READ(narenas, unsigned);

	ret = 0;
label_return:
	malloc_mutex_unlock(tsd_tsdn(tsd), &ctl_mtx);
	return ret;
}